

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O1

Array<Corrade::Containers::BasicStringView<char>,_void_(*)(Corrade::Containers::BasicStringView<char>_*,_unsigned_long)>
* __thiscall
Corrade::Containers::BasicStringView<char>::splitOnWhitespaceWithoutEmptyParts
          (Array<Corrade::Containers::BasicStringView<char>,_void_(*)(Corrade::Containers::BasicStringView<char>_*,_unsigned_long)>
           *__return_storage_ptr__,BasicStringView<char> *this)

{
  StringView delimiters;
  
  delimiters._sizePlusFlags = 0xc000000000000006;
  delimiters._data = " \t\f\v\r\n";
  splitOnAnyWithoutEmptyParts(__return_storage_ptr__,this,delimiters);
  return __return_storage_ptr__;
}

Assistant:

Array<BasicStringView<T>> BasicStringView<T>::splitOnWhitespaceWithoutEmptyParts() const {
    #if !defined(CORRADE_TARGET_MSVC) || defined(CORRADE_TARGET_CLANG_CL) || _MSC_VER >= 1930 /* MSVC 2022 works */
    return splitOnAnyWithoutEmptyParts(Whitespace);
    #else
    using namespace Literals;
    return splitOnAnyWithoutEmptyParts(WHITESPACE_MACRO_BECAUSE_MSVC_IS_STUPID);
    #endif
}